

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

string * __thiscall
wasm::PassRegistry::getPassDescription
          (string *__return_storage_ptr__,PassRegistry *this,string *name)

{
  iterator iVar1;
  mapped_type *pmVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->passInfos)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
             ::operator[](&this->passInfos,name);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("passInfos.find(name) != passInfos.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                ,0x4d,"std::string wasm::PassRegistry::getPassDescription(std::string)");
}

Assistant:

std::string PassRegistry::getPassDescription(std::string name) {
  assert(passInfos.find(name) != passInfos.end());
  return passInfos[name].description;
}